

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.h
# Opt level: O0

void dmrC_use_pseudo(dmr_C *C,instruction *insn,pseudo_t p,pseudo_t *pp)

{
  int iVar1;
  pseudo_user *user;
  pseudo_t *pp_local;
  pseudo_t p_local;
  instruction *insn_local;
  dmr_C *C_local;
  
  *pp = p;
  iVar1 = dmrC_has_use_list(p);
  if (iVar1 != 0) {
    user = dmrC_alloc_pseudo_user(C,insn,pp);
    dmrC_add_pseudo_user_ptr(C,user,&p->users);
  }
  return;
}

Assistant:

static inline void dmrC_use_pseudo(struct dmr_C *C, struct instruction *insn, pseudo_t p, pseudo_t *pp)
{
	*pp = p;
	if (dmrC_has_use_list(p))
		dmrC_add_pseudo_user_ptr(C, dmrC_alloc_pseudo_user(C, insn, pp), &p->users);
}